

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

string * __thiscall
spvtools::spvInstructionBinaryToText_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,spv_target_env env,uint32_t *instCode,
          size_t instWordCount,uint32_t *code,size_t wordCount,uint32_t options)

{
  undefined8 uVar1;
  undefined8 uVar2;
  spv_text text_00;
  undefined8 __p;
  bool bVar3;
  spv_context context_00;
  undefined4 in_register_00000014;
  spv_context context;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  friendly_mapper;
  size_t wordCount_local;
  uint32_t *code_local;
  NameMapper name_mapper;
  spv_text text;
  _Any_data local_2d8;
  code *local_2c8;
  undefined1 local_2b8 [24];
  spv_ext_inst_table local_2a0;
  WrappedDisassembler wrapped;
  Disassembler disassembler;
  
  wordCount_local = (size_t)code;
  code_local = (uint32_t *)instWordCount;
  context_00 = spvContextCreate((spv_target_env)this);
  local_2b8._0_4_ = context_00->target_env;
  uVar1 = context_00->opcode_table;
  uVar2 = context_00->operand_table;
  local_2b8._16_4_ = (int)uVar1;
  local_2b8._8_8_ = uVar2;
  local_2b8._20_4_ = (int)((ulong)uVar1 >> 0x20);
  local_2a0 = context_00->ext_inst_table;
  context = context_00;
  bVar3 = AssemblyGrammar::isValid((AssemblyGrammar *)local_2b8);
  if (bVar3) {
    friendly_mapper._M_t.
    super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
    .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>,_true,_true>
          )(__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
            )0x0;
    GetTrivialNameMapper_abi_cxx11_();
    if ((wordCount & 0x40) != 0) {
      MakeUnique<spvtools::FriendlyNameMapper,spv_context_t*&,unsigned_int_const*&,unsigned_long_const&>
                ((spvtools *)&disassembler,&context,&code_local,&wordCount_local);
      __p = disassembler._0_8_;
      disassembler.print_ = false;
      disassembler.nested_indent_ = false;
      disassembler.reorder_blocks_ = false;
      disassembler._3_1_ = 0;
      disassembler.endian_ = SPV_ENDIANNESS_LITTLE;
      std::
      __uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
      ::reset((__uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
               *)&friendly_mapper,(pointer)__p);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      ~unique_ptr((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                   *)&disassembler);
      disassembler.text_ = (stringstream)0x0;
      disassembler._9_7_ = 0;
      disassembler._0_8_ =
           friendly_mapper._M_t.
           super___uniq_ptr_impl<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::FriendlyNameMapper_*,_std::default_delete<spvtools::FriendlyNameMapper>_>
           .super__Head_base<0UL,_spvtools::FriendlyNameMapper_*,_false>._M_head_impl;
      disassembler._24_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/name_mapper.h:73:12)>
           ::_M_invoke;
      disassembler._16_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/name_mapper.h:73:12)>
           ::_M_manager;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=(&name_mapper,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler);
      if (disassembler._16_8_ != 0) {
        (*(code *)disassembler._16_8_)(&disassembler,&disassembler,3);
      }
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)&local_2d8,&name_mapper);
    anon_unknown_0::Disassembler::Disassembler
              (&disassembler,(AssemblyGrammar *)local_2b8,(uint32_t)wordCount,
               (NameMapper *)&local_2d8);
    if (local_2c8 != (code *)0x0) {
      (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
    }
    wrapped.disassembler_ = &disassembler;
    wrapped.inst_binary_ = (uint32_t *)CONCAT44(in_register_00000014,env);
    wrapped.word_count_ = (size_t)instCode;
    spvBinaryParse(context,&wrapped,code_local,wordCount_local,
                   anon_unknown_0::DisassembleTargetHeader,
                   anon_unknown_0::DisassembleTargetInstruction,(spv_diagnostic *)0x0);
    text = (spv_text)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    anon_unknown_0::Disassembler::SaveTextResult(&disassembler,&text);
    text_00 = text;
    std::__cxx11::string::assign<char_const*,void>
              ((string *)__return_storage_ptr__,text->str,text->str + text->length);
    while ((__return_storage_ptr__->_M_string_length != 0 &&
           ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            == '\n'))) {
      std::__cxx11::string::pop_back();
    }
    spvTextDestroy(text_00);
    spvContextDestroy(context);
    anon_unknown_0::Disassembler::~Disassembler(&disassembler);
    if (name_mapper.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*name_mapper.super__Function_base._M_manager)
                ((_Any_data *)&name_mapper,(_Any_data *)&name_mapper,__destroy_functor);
    }
    std::
    unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
    ~unique_ptr(&friendly_mapper);
  }
  else {
    spvContextDestroy(context_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&disassembler);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string spvInstructionBinaryToText(const spv_target_env env,
                                       const uint32_t* instCode,
                                       const size_t instWordCount,
                                       const uint32_t* code,
                                       const size_t wordCount,
                                       const uint32_t options) {
  spv_context context = spvContextCreate(env);
  const AssemblyGrammar grammar(context);
  if (!grammar.isValid()) {
    spvContextDestroy(context);
    return "";
  }

  // Generate friendly names for Ids if requested.
  std::unique_ptr<FriendlyNameMapper> friendly_mapper;
  NameMapper name_mapper = GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = MakeUnique<FriendlyNameMapper>(context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  Disassembler disassembler(grammar, options, name_mapper);
  WrappedDisassembler wrapped(&disassembler, instCode, instWordCount);
  spvBinaryParse(context, &wrapped, code, wordCount, DisassembleTargetHeader,
                 DisassembleTargetInstruction, nullptr);

  spv_text text = nullptr;
  std::string output;
  if (disassembler.SaveTextResult(&text) == SPV_SUCCESS) {
    output.assign(text->str, text->str + text->length);
    // Drop trailing newline characters.
    while (!output.empty() && output.back() == '\n') output.pop_back();
  }
  spvTextDestroy(text);
  spvContextDestroy(context);

  return output;
}